

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O1

int read_line(lua_State *L,FILE *f)

{
  char *__s;
  bool bVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  size_t sVar5;
  uint unaff_EBP;
  luaL_Buffer b;
  luaL_Buffer local_2040;
  
  __s = local_2040.buffer;
  local_2040.lvl = 0;
  local_2040.p = __s;
  local_2040.L = L;
  do {
    iVar2 = emptybuffer(&local_2040);
    if (iVar2 != 0) {
      adjuststack(&local_2040);
    }
    pcVar3 = fgets(__s,0x2000,(FILE *)f);
    if (pcVar3 == (char *)0x0) {
      emptybuffer(&local_2040);
      lua_concat(local_2040.L,local_2040.lvl);
      local_2040.lvl = 1;
      sVar5 = lua_objlen(L,-1);
      unaff_EBP = (uint)(sVar5 != 0);
LAB_00110d78:
      bVar1 = false;
    }
    else {
      sVar4 = strlen(__s);
      if ((sVar4 != 0) && (local_2040.buffer[sVar4 - 1] == '\n')) {
        local_2040.p = local_2040.p + (sVar4 - 1);
        emptybuffer(&local_2040);
        lua_concat(local_2040.L,local_2040.lvl);
        local_2040.lvl = 1;
        unaff_EBP = 1;
        goto LAB_00110d78;
      }
      local_2040.p = local_2040.p + sVar4;
      bVar1 = true;
    }
    if (!bVar1) {
      return unaff_EBP;
    }
  } while( true );
}

Assistant:

static int read_line(lua_State*L,FILE*f){
luaL_Buffer b;
luaL_buffinit(L,&b);
for(;;){
size_t l;
char*p=luaL_prepbuffer(&b);
if(fgets(p,BUFSIZ,f)==NULL){
luaL_pushresult(&b);
return(lua_objlen(L,-1)>0);
}
l=strlen(p);
if(l==0||p[l-1]!='\n')
luaL_addsize(&b,l);
else{
luaL_addsize(&b,l-1);
luaL_pushresult(&b);
return 1;
}
}
}